

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astlist.c
# Opt level: O2

void InitParams(ASTList *params,int totalFuncs)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)totalFuncs;
  if (totalFuncs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x20 != uVar2; uVar2 = uVar2 + 0x20) {
    puVar1 = (undefined8 *)((long)&params->first + uVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&params->current + uVar2) = 0;
    *(undefined8 *)((long)&params->size + uVar2) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void InitParams(ASTList* params, int totalFuncs){
	for (int i = 0; i < totalFuncs; i++){
		params[i].first = NULL;
		params[i].last = NULL;
		params[i].current = NULL;
		params[i].size = -1;
		params[i].nodeId = -1;
	}
}